

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O3

void Cba_ManWriteBlifLines(FILE *pFile,Cba_Ntk_t *p)

{
  long lVar1;
  Vec_Int_t *p_00;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long *plVar12;
  long local_48;
  
  uVar3 = (p->vObjType).nSize;
  uVar9 = (ulong)uVar3;
  if (1 < (int)uVar3) {
    p_00 = &p->vFonName;
    lVar11 = 1;
    do {
      if ((int)uVar9 <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar2 = (p->vObjType).pArray[lVar11];
      if (0xffffffa8 < bVar2 - 0x5a) {
        if (bVar2 == 0x49) {
          pcVar6 = Abc_NamStr(p->pDesign->pMods,0);
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar6,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar6);
          lVar7 = (long)(p->vObjFin0).nSize;
          if ((lVar7 <= lVar11) || (lVar1 = lVar11 + 1, lVar7 <= lVar1)) {
LAB_003ed402:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar3 = (p->vObjFin0).pArray[lVar11];
          uVar9 = (ulong)uVar3;
          iVar4 = 0;
          while ((int)uVar9 < (p->vObjFin0).pArray[lVar11 + 1]) {
            if ((int)uVar3 < 1) goto LAB_003ed449;
            if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003ed402;
            iVar10 = (p->vFinFon).pArray[uVar9];
            pcVar6 = Mio_GateReadPinName(pGate,iVar4);
            if ((p->vFonName).nSize < 1) goto LAB_003ed42a;
            if (iVar10 < 1) goto LAB_003ed421;
            iVar10 = Vec_IntGetEntry(p_00,iVar10);
            pcVar8 = Abc_NamStr(p->pDesign->pStrs,iVar10);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar8);
            uVar9 = uVar9 + 1;
            iVar4 = iVar4 + 1;
            if ((p->vObjFin0).nSize <= lVar1) goto LAB_003ed402;
          }
          lVar7 = (long)(p->vObjFon0).nSize;
          if ((lVar7 <= lVar11) || (lVar7 <= lVar1)) goto LAB_003ed402;
          iVar4 = (p->vObjFon0).pArray[lVar11];
          iVar10 = iVar4;
          while (iVar10 < (p->vObjFon0).pArray[lVar11 + 1]) {
            pcVar6 = Mio_GateReadOutName(pGate);
            if ((p->vFonName).nSize < 1) goto LAB_003ed42a;
            if (iVar4 < 1) goto LAB_003ed421;
            iVar5 = Vec_IntGetEntry(p_00,iVar10);
            pcVar8 = Abc_NamStr(p->pDesign->pStrs,iVar5);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar8);
            iVar10 = iVar10 + 1;
            if ((p->vObjFon0).nSize <= lVar1) goto LAB_003ed402;
          }
        }
        else {
          if (bVar2 != 3) {
            fwrite(".names",6,1,(FILE *)pFile);
            lVar7 = (long)(p->vObjFin0).nSize;
            if ((lVar7 <= lVar11) || (lVar7 <= lVar11 + 1)) goto LAB_003ed402;
            uVar3 = (p->vObjFin0).pArray[lVar11];
            uVar9 = (ulong)uVar3;
            while ((int)uVar9 < (p->vObjFin0).pArray[lVar11 + 1]) {
              if ((int)uVar3 < 1) goto LAB_003ed449;
              if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003ed402;
              if ((p->vFonName).nSize < 1) goto LAB_003ed42a;
              iVar4 = (p->vFinFon).pArray[uVar9];
              if (iVar4 < 1) goto LAB_003ed421;
              iVar4 = Vec_IntGetEntry(p_00,iVar4);
              pcVar6 = Abc_NamStr(p->pDesign->pStrs,iVar4);
              fprintf((FILE *)pFile," %s",pcVar6);
              uVar9 = uVar9 + 1;
              if ((long)(p->vObjFin0).nSize <= lVar11 + 1) goto LAB_003ed402;
            }
            if ((p->vObjFon0).nSize <= lVar11) goto LAB_003ed402;
            if ((p->vFonName).nSize < 1) {
LAB_003ed42a:
              pcVar6 = "Cba_NtkHasFonNames(p)";
LAB_003ed431:
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0x11e,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
            }
            iVar4 = (p->vObjFon0).pArray[lVar11];
            if (iVar4 < 1) {
LAB_003ed421:
              pcVar6 = "Cba_FonIsReal(f)";
              goto LAB_003ed431;
            }
            iVar4 = Vec_IntGetEntry(p_00,iVar4);
            pcVar6 = Abc_NamStr(p->pDesign->pStrs,iVar4);
            fprintf((FILE *)pFile," %s",pcVar6);
            if ((p->vObjFunc).nSize < 1) {
              __assert_fail("Cba_NtkHasObjFuncs(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xef,"int Cba_ObjFunc(Cba_Ntk_t *, int)");
            }
            iVar4 = Vec_IntGetEntry(&p->vObjFunc,(int)lVar11);
            pcVar6 = Abc_NamStr(p->pDesign->pFuns,iVar4);
            fprintf((FILE *)pFile,"\n%s",pcVar6);
            goto LAB_003ed3e3;
          }
          if ((((p->vObjFunc).nSize < 1) ||
              (uVar3 = Vec_IntGetEntry(&p->vObjFunc,(int)lVar11), (int)uVar3 < 1)) ||
             ((p->pDesign->vNtks).nSize <= (int)uVar3)) {
            plVar12 = (long *)0x0;
          }
          else {
            plVar12 = (long *)(p->pDesign->vNtks).pArray[uVar3];
          }
          fwrite(".subckt",7,1,(FILE *)pFile);
          pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(*plVar12 + 0x10),*(int *)((long)plVar12 + 0xc));
          fprintf((FILE *)pFile," %s",pcVar6);
          lVar7 = (long)(p->vObjFin0).nSize;
          if ((lVar7 <= lVar11) || (lVar7 <= lVar11 + 1)) goto LAB_003ed402;
          uVar3 = (p->vObjFin0).pArray[lVar11];
          lVar7 = 0;
          while( true ) {
            local_48 = lVar11 + 1;
            iVar4 = (int)lVar7 + uVar3;
            if ((p->vObjFin0).pArray[lVar11 + 1] <= iVar4) break;
            if ((int)uVar3 < 1) {
LAB_003ed449:
              __assert_fail("f>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
            }
            if (((p->vFinFon).nSize <= iVar4) || (*(int *)((long)plVar12 + 0x1c) <= lVar7))
            goto LAB_003ed402;
            iVar4 = *(int *)(plVar12[4] + lVar7 * 4);
            if (iVar4 < 1) goto LAB_003ed487;
            if (*(int *)((long)plVar12 + 0xcc) < 1) goto LAB_003ed468;
            iVar10 = (p->vFinFon).pArray[(ulong)uVar3 + lVar7];
            iVar4 = Vec_IntGetEntry((Vec_Int_t *)(plVar12 + 0x19),iVar4);
            pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(*plVar12 + 0x10),iVar4);
            if ((p->vFonName).nSize < 1) goto LAB_003ed42a;
            if (iVar10 < 1) goto LAB_003ed421;
            iVar4 = Vec_IntGetEntry(p_00,iVar10);
            pcVar8 = Abc_NamStr(p->pDesign->pStrs,iVar4);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar8);
            lVar7 = lVar7 + 1;
            if ((p->vObjFin0).nSize <= local_48) goto LAB_003ed402;
          }
          lVar7 = (long)(p->vObjFon0).nSize;
          if ((lVar7 <= lVar11) || (lVar7 <= lVar11 + 1)) goto LAB_003ed402;
          iVar4 = (p->vObjFon0).pArray[lVar11];
          lVar7 = 0;
          while( true ) {
            local_48 = lVar11 + 1;
            iVar10 = iVar4 + (int)lVar7;
            if ((p->vObjFon0).pArray[lVar11 + 1] <= iVar10) break;
            if (*(int *)((long)plVar12 + 0x2c) <= lVar7) goto LAB_003ed402;
            iVar5 = *(int *)(plVar12[6] + lVar7 * 4);
            if (iVar5 < 1) {
LAB_003ed487:
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xf1,"char *Cba_ObjNameStr(Cba_Ntk_t *, int)");
            }
            if (*(int *)((long)plVar12 + 0xcc) < 1) {
LAB_003ed468:
              __assert_fail("Cba_NtkHasObjNames(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
            }
            iVar5 = Vec_IntGetEntry((Vec_Int_t *)(plVar12 + 0x19),iVar5);
            pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(*plVar12 + 0x10),iVar5);
            if ((p->vFonName).nSize < 1) goto LAB_003ed42a;
            if (iVar4 < 1) goto LAB_003ed421;
            iVar10 = Vec_IntGetEntry(p_00,iVar10);
            pcVar8 = Abc_NamStr(p->pDesign->pStrs,iVar10);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar8);
            lVar7 = lVar7 + 1;
            if ((p->vObjFon0).nSize <= local_48) goto LAB_003ed402;
          }
        }
        fputc(10,(FILE *)pFile);
      }
LAB_003ed3e3:
      lVar11 = lVar11 + 1;
      uVar9 = (ulong)(p->vObjType).nSize;
    } while (lVar11 < (long)uVar9);
  }
  return;
}

Assistant:

void Cba_ManWriteBlifLines( FILE * pFile, Cba_Ntk_t * p )
{
    int k, iObj, iFin, iFon;
    Cba_NtkForEachBox( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_Ntk_t * pNtk = Cba_ObjNtk( p, iObj );
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Cba_NtkName(pNtk) );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPi(pNtk, k)), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPo(pNtk, k)), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else if ( Cba_ObjIsGate(p, iObj) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Cba_ObjNtkId( p, iObj ));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s", Cba_FonNameStr(p, iFon) );
            fprintf( pFile, " %s", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)) );
            fprintf( pFile, "\n%s",  Cba_NtkSop(p, Cba_ObjFunc(p, iObj)) );
        }
    }
}